

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler_test.cc
# Opt level: O0

void __thiscall
SamplerTest_LargeAndSmallAllocs_CombinedTest_Test::
~SamplerTest_LargeAndSmallAllocs_CombinedTest_Test
          (SamplerTest_LargeAndSmallAllocs_CombinedTest_Test *this)

{
  SamplerTest_LargeAndSmallAllocs_CombinedTest_Test *this_local;
  
  ~SamplerTest_LargeAndSmallAllocs_CombinedTest_Test(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_F(SamplerTest, LargeAndSmallAllocs_CombinedTest) {
  tcmalloc::Sampler sampler;
  sampler.Init(1);
  int counter_big = 0;
  int counter_small = 0;
  int size_big = 129*8*1024+1;
  int size_small = 1024*8;
  int num_iters = 128*4*8;
  // Allocate in mixed chunks
  for (int i = 0; i < num_iters; i++) {
    if (!sampler.RecordAllocation(size_big)) {
      counter_big += 1;
    }
    for (int i = 0; i < 129; i++) {
      if (!sampler.RecordAllocation(size_small)) {
        counter_small += 1;
      }
    }
  }
  // Now test that there are the right number of each
  double large_allocs_sds =
     StandardDeviationsErrorInSample(num_iters, counter_big,
                                     size_big, kSamplingInterval);
  double small_allocs_sds =
     StandardDeviationsErrorInSample(num_iters*129, counter_small,
                                     size_small, kSamplingInterval);
  LOG(INFO) << StringPrintf("large_allocs_sds = %f\n", large_allocs_sds);
  LOG(INFO) << StringPrintf("small_allocs_sds = %f\n", small_allocs_sds);
  ASSERT_LE(fabs(large_allocs_sds), kSigmas);
  ASSERT_LE(fabs(small_allocs_sds), kSigmas);
}